

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  float *pfVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  int k;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  void *pvVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  int i_3;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  Mat out;
  Mat top_blob_bordered;
  int local_d0;
  Mat m;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar23 = bottom_blob->w;
  uVar27 = bottom_blob->h;
  iVar9 = bottom_blob->c;
  sVar3 = bottom_blob->elemsize;
  iVar8 = this->kernel_w;
  iVar10 = this->dilation_w;
  iVar25 = this->kernel_h;
  iVar15 = this->dilation_h;
  iVar18 = this->stride_w;
  iVar16 = this->stride_h;
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  auVar30._0_4_ = -(uint)(0 < this->pad_left);
  auVar30._4_4_ = -(uint)(0 < this->pad_right);
  auVar30._8_4_ = -(uint)(0 < this->pad_top);
  auVar30._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar14 = movmskps(uVar27,auVar30);
  lVar20 = 0x10;
  if ((((iVar14 == 0) && (this->output_pad_right < 1)) && (this->output_pad_bottom < 1)) &&
     ((this->output_w < 1 || (this->output_h < 1)))) {
    Mat::operator=(&top_blob_bordered,top_blob);
    lVar20 = 8;
  }
  iVar18 = (iVar8 + -1) * iVar10 + (uVar23 - 1) * iVar18 + 1;
  iVar8 = (iVar25 + -1) * iVar15 + 1 + (uVar27 - 1) * iVar16;
  Mat::create(&top_blob_bordered,iVar18,iVar8,this->num_output,sVar3,
              *(Allocator **)(&opt->lightmode + lVar20));
  iVar10 = -100;
  if (top_blob_bordered.data == (void *)0x0) goto LAB_00129712;
  if ((long)top_blob_bordered.c * top_blob_bordered.cstep == 0) goto LAB_00129712;
  uVar7 = this->kernel_w * this->kernel_h;
  std::vector<int,_std::allocator<int>_>::vector
            (&_space_ofs,(long)(int)uVar7,(allocator_type *)&out);
  iVar10 = this->dilation_h;
  iVar25 = this->kernel_w;
  iVar15 = this->dilation_w * iVar25;
  iVar14 = 0;
  lVar20 = 0;
  for (iVar16 = 0; iVar16 < this->kernel_h; iVar16 = iVar16 + 1) {
    for (lVar21 = 0; (int)lVar21 < iVar25; lVar21 = lVar21 + 1) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar20 + lVar21] = iVar14;
      iVar14 = iVar14 + this->dilation_w;
      iVar25 = this->kernel_w;
    }
    iVar14 = iVar14 + (iVar10 * iVar18 - iVar15);
    lVar20 = (int)lVar20 + lVar21;
  }
  uVar22 = 0;
  uVar26 = 0;
  if (0 < (int)uVar7) {
    uVar26 = (ulong)uVar7;
  }
  iVar10 = 0;
  if (0 < iVar9) {
    iVar10 = iVar9;
  }
  uVar11 = (ulong)uVar23;
  if ((int)uVar23 < 1) {
    uVar11 = uVar22;
  }
  uVar12 = (ulong)uVar27;
  if ((int)uVar27 < 1) {
    uVar12 = uVar22;
  }
  uVar23 = iVar8 * iVar18;
  uVar24 = (ulong)uVar23;
  if ((int)uVar23 < 1) {
    uVar24 = uVar22;
  }
  lVar20 = 0;
  while( true ) {
    auVar6 = (undefined1  [16])top_blob_bordered._48_16_;
    auVar30 = (undefined1  [16])top_blob_bordered._32_16_;
    if (this->num_output <= lVar20) break;
    out.data = (void *)(top_blob_bordered.cstep * lVar20 * top_blob_bordered.elemsize +
                       (long)top_blob_bordered.data);
    out.refcount = (int *)0x0;
    out.elemsize = top_blob_bordered.elemsize;
    out.elempack = top_blob_bordered.elempack;
    out.allocator = top_blob_bordered.allocator;
    out.w = top_blob_bordered.w;
    out.dims = 2;
    out.c = 1;
    out.h = top_blob_bordered.h;
    out.cstep = (size_t)(top_blob_bordered.h * top_blob_bordered.w);
    if (this->bias_term == 0) {
      fVar28 = 0.0;
    }
    else {
      fVar28 = *(float *)((long)(this->bias_data).data + lVar20 * 4);
    }
    Mat::fill(&out,fVar28);
    for (iVar8 = 0; pvVar5 = out.data, local_d0 = (int)uVar12, iVar8 != local_d0; iVar8 = iVar8 + 1)
    {
      for (uVar17 = 0; pvVar5 = out.data, uVar17 != uVar11; uVar17 = uVar17 + 1) {
        lVar21 = (long)(int)uVar17 * (long)this->stride_w * 4 +
                 (long)out.w * (long)this->stride_h * (long)iVar8 * out.elemsize;
        pvVar19 = (void *)((long)(this->weight_data).data + (long)(int)uVar22 * 4);
        for (iVar25 = 0; iVar25 != iVar10; iVar25 = iVar25 + 1) {
          Mat::channel(&m,bottom_blob,iVar25);
          fVar28 = *(float *)((long)m.data + uVar17 * 4 + (long)m.w * (long)iVar8 * m.elemsize);
          for (uVar13 = 0; uVar26 != uVar13; uVar13 = uVar13 + 1) {
            *(float *)((long)pvVar5 +
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13] * 4 + lVar21) =
                 *(float *)((long)pvVar19 + uVar13 * 4) * fVar28 +
                 *(float *)((long)pvVar5 +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar13] * 4 + lVar21);
          }
          Mat::~Mat(&m);
          pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar7 * 4);
        }
      }
    }
    switch(this->activation_type) {
    case 1:
      for (uVar17 = 0; uVar24 != uVar17; uVar17 = uVar17 + 1) {
        fVar28 = *(float *)((long)out.data + uVar17 * 4);
        if (fVar28 <= 0.0) {
          fVar28 = 0.0;
        }
        *(float *)((long)out.data + uVar17 * 4) = fVar28;
      }
      break;
    case 2:
      uVar23 = *(this->activation_params).data;
      for (uVar17 = 0; uVar24 != uVar17; uVar17 = uVar17 + 1) {
        fVar28 = *(float *)((long)out.data + uVar17 * 4);
        uVar27 = -(uint)(0.0 < fVar28);
        *(float *)((long)out.data + uVar17 * 4) =
             (float)(~uVar27 & uVar23 | uVar27 & 0x3f800000) * fVar28;
      }
      break;
    case 3:
      pfVar4 = (float *)(this->activation_params).data;
      fVar28 = *pfVar4;
      fVar1 = pfVar4[1];
      for (uVar17 = 0; uVar24 != uVar17; uVar17 = uVar17 + 1) {
        fVar2 = *(float *)((long)out.data + uVar17 * 4);
        fVar31 = fVar2;
        if (fVar2 <= fVar28) {
          fVar31 = fVar28;
        }
        if ((fVar2 < fVar28) || (fVar1 < fVar31)) {
          if (fVar1 <= fVar31) {
            fVar31 = fVar1;
          }
          *(float *)((long)out.data + uVar17 * 4) = fVar31;
        }
      }
      break;
    case 4:
      for (uVar17 = 0; uVar24 != uVar17; uVar17 = uVar17 + 1) {
        fVar28 = expf(-*(float *)((long)pvVar5 + uVar17 * 4));
        *(float *)((long)pvVar5 + uVar17 * 4) = 1.0 / (fVar28 + 1.0);
      }
    }
    Mat::~Mat(&out);
    lVar20 = lVar20 + 1;
    uVar22 = (ulong)((int)uVar22 + iVar9 * uVar7);
  }
  auVar29._0_4_ = -(uint)(0 < this->pad_left);
  auVar29._4_4_ = -(uint)(0 < this->pad_right);
  auVar29._8_4_ = -(uint)(0 < this->pad_top);
  auVar29._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar9 = movmskps(this->num_output,auVar29);
  if (iVar9 == 0) {
    if ((0 < this->output_w) && (0 < this->output_h)) {
      out.refcount = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,
                                     top_blob_bordered.refcount._0_4_);
      out.data = top_blob_bordered.data;
      out.elemsize = top_blob_bordered.elemsize;
      out.elempack = top_blob_bordered.elempack;
      out.allocator = top_blob_bordered.allocator;
      out.dims = top_blob_bordered.dims;
      out.w = top_blob_bordered.w;
      out.h = top_blob_bordered.h;
      out.c = top_blob_bordered.c;
      out.cstep = top_blob_bordered.cstep;
      if (out.refcount != (int *)0x0) {
        LOCK();
        *out.refcount = *out.refcount + 1;
        UNLOCK();
      }
      top_blob_bordered._32_16_ = auVar30;
      top_blob_bordered._48_16_ = auVar6;
      if (0 < this->output_pad_bottom || 0 < this->output_pad_right) {
        m.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        m.data = *(void **)opt;
        m.elemsize = (size_t)opt->workspace_allocator;
        m._24_8_ = *(undefined8 *)&opt->use_winograd_convolution;
        m.refcount = (int *)opt->workspace_allocator;
        copy_make_border(&top_blob_bordered,&out,0,this->output_pad_bottom,0,this->output_pad_right,
                         0,0.0,(Option *)&m);
        if ((out.data == (void *)0x0) || ((long)out.c * out.cstep == 0)) goto LAB_00129685;
      }
      iVar8 = out.w - this->output_w;
      iVar9 = out.h - this->output_h;
      if ((this->pad_left == -0xe9) ||
         (((this->pad_right == -0xe9 || (this->pad_top == -0xe9)) || (this->pad_bottom == -0xe9))))
      {
        iVar10 = iVar9 / 2;
        iVar25 = iVar9 - iVar10;
        iVar9 = iVar8 / 2;
        iVar15 = iVar8 - iVar9;
LAB_00129648:
        copy_cut_border(&out,top_blob,iVar10,iVar25,iVar9,iVar15,opt);
      }
      else if ((this->pad_top == -0xea || (this->pad_right == -0xea || this->pad_left == -0xea)) ||
               this->pad_bottom == -0xea) {
        iVar25 = iVar9 / 2;
        iVar10 = iVar9 - iVar25;
        iVar15 = iVar8 / 2;
        iVar9 = iVar8 - iVar15;
        goto LAB_00129648;
      }
      if (top_blob->data == (void *)0x0) goto LAB_00129685;
      iVar9 = top_blob->c;
      sVar3 = top_blob->cstep;
      Mat::~Mat(&out);
      if ((long)iVar9 * sVar3 != 0) goto LAB_00129703;
      goto LAB_0012968f;
    }
    if (this->output_pad_bottom < 1 && this->output_pad_right < 1) {
      Mat::operator=(top_blob,&top_blob_bordered);
      goto LAB_00129703;
    }
    copy_make_border(&top_blob_bordered,top_blob,0,this->output_pad_bottom,0,this->output_pad_right,
                     0,0.0,opt);
    iVar10 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
    goto LAB_00129703;
  }
  else {
    out.refcount = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_
                                  );
    out.data = top_blob_bordered.data;
    out.elemsize = top_blob_bordered.elemsize;
    out.elempack = top_blob_bordered.elempack;
    out.allocator = top_blob_bordered.allocator;
    out.dims = top_blob_bordered.dims;
    out.w = top_blob_bordered.w;
    out.h = top_blob_bordered.h;
    out.c = top_blob_bordered.c;
    out.cstep = top_blob_bordered.cstep;
    if (out.refcount != (int *)0x0) {
      LOCK();
      *out.refcount = *out.refcount + 1;
      UNLOCK();
    }
    top_blob_bordered._32_16_ = auVar30;
    top_blob_bordered._48_16_ = auVar6;
    if (this->output_pad_bottom < 1 && this->output_pad_right < 1) {
LAB_00129450:
      copy_cut_border(&out,top_blob,this->pad_top,this->pad_bottom,this->pad_left,this->pad_right,
                      opt);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        Mat::~Mat(&out);
LAB_00129703:
        iVar10 = 0;
        goto LAB_00129705;
      }
    }
    else {
      m.allocator = *(Allocator **)&opt->use_int8_arithmetic;
      m.data = *(void **)opt;
      m.elemsize = (size_t)opt->workspace_allocator;
      m._24_8_ = *(undefined8 *)&opt->use_winograd_convolution;
      m.refcount = (int *)opt->workspace_allocator;
      copy_make_border(&top_blob_bordered,&out,0,this->output_pad_bottom,0,this->output_pad_right,0,
                       0.0,(Option *)&m);
      if ((out.data != (void *)0x0) && ((long)out.c * out.cstep != 0)) goto LAB_00129450;
    }
LAB_00129685:
    Mat::~Mat(&out);
LAB_0012968f:
    iVar10 = -100;
  }
LAB_00129705:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
LAB_00129712:
  Mat::~Mat(&top_blob_bordered);
  return iVar10;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || output_pad_right > 0 || output_pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        copy_cut_border(top_blob_bordered_adj, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else if (output_w > 0 && output_h > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        int wcut = top_blob_bordered_adj.w - output_w;
        int hcut = top_blob_bordered_adj.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            copy_make_border(top_blob_bordered, top_blob, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt);
            if (top_blob.empty())
                return -100;
        }
        else
        {
            top_blob = top_blob_bordered;
        }
    }

    return 0;
}